

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk,void *p,size_t where)

{
  ulong uVar1;
  void **ppvVar2;
  ulong uVar3;
  size_t __n;
  size_t sVar4;
  
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_001ad8e2:
    sVar4 = 0;
  }
  else {
    if (0x7ffffffe < sk->num) {
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                    ,0x8b);
      return 0;
    }
    uVar3 = sk->num_alloc;
    if (uVar3 <= sk->num + 1) {
      uVar1 = uVar3 + 1;
      sVar4 = uVar3 * 8 + 8;
      if (-1 < (long)uVar3) {
        sVar4 = uVar3 << 4;
        uVar1 = uVar3 * 2;
      }
      if ((sVar4 >> 3 != uVar1 || uVar1 < uVar3) ||
         (ppvVar2 = (void **)OPENSSL_realloc(sk->data,sVar4), ppvVar2 == (void **)0x0))
      goto LAB_001ad8e2;
      sk->data = ppvVar2;
      sk->num_alloc = uVar1;
    }
    uVar3 = sk->num;
    if ((where <= uVar3 && uVar3 - where != 0) &&
       (__n = (uVar3 - where) * 8, uVar3 = where, __n != 0)) {
      memmove(sk->data + where + 1,sk->data + where,__n);
    }
    sk->data[uVar3] = p;
    sVar4 = sk->num + 1;
    sk->num = sVar4;
    sk->sorted = 0;
  }
  return sVar4;
}

Assistant:

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk, void *p, size_t where) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->num >= INT_MAX) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    return 0;
  }

  if (sk->num_alloc <= sk->num + 1) {
    // Attempt to double the size of the array.
    size_t new_alloc = sk->num_alloc << 1;
    size_t alloc_size = new_alloc * sizeof(void *);
    void **data;

    // If the doubling overflowed, try to increment.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      new_alloc = sk->num_alloc + 1;
      alloc_size = new_alloc * sizeof(void *);
    }

    // If the increment also overflowed, fail.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      return 0;
    }

    data = reinterpret_cast<void **>(OPENSSL_realloc(sk->data, alloc_size));
    if (data == NULL) {
      return 0;
    }

    sk->data = data;
    sk->num_alloc = new_alloc;
  }

  if (where >= sk->num) {
    sk->data[sk->num] = p;
  } else {
    OPENSSL_memmove(&sk->data[where + 1], &sk->data[where],
                    sizeof(void *) * (sk->num - where));
    sk->data[where] = p;
  }

  sk->num++;
  sk->sorted = 0;

  return sk->num;
}